

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgcnn(fitsfile *fptr,int casesen,char *templt,char *colname,int *colnum,int *status)

{
  int iVar1;
  bool bVar2;
  tcolumn *local_c8;
  tcolumn *colptr;
  long ivalue;
  int local_b0;
  int unique;
  int exact;
  int match;
  int foundw;
  int founde;
  int ii;
  int tstatus;
  char errmsg [81];
  int *status_local;
  int *colnum_local;
  char *colname_local;
  char *templt_local;
  int casesen_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    fptr->Fptr->startcol = 0;
    founde = 0;
  }
  else {
    if (*status != 0xed) {
      return *status;
    }
    founde = 0xed;
    *status = 0;
  }
  *colname = '\0';
  *colnum = 0;
  unique0x10000273 = status;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
      return *stack0xffffffffffffffc0;
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  local_c8 = fptr->Fptr->tableptr + fptr->Fptr->startcol;
  match = 0;
  exact = 0;
  ivalue._4_4_ = 0;
  foundw = fptr->Fptr->startcol;
  do {
    if (fptr->Fptr->tfield <= foundw) {
      if (match == 0) {
        if (exact == 0) {
          ffc2ii(templt,(long *)&colptr,&founde);
          if (((founde == 0) && ((long)colptr <= (long)fptr->Fptr->tfield)) && (0 < (long)colptr)) {
            *colnum = (int)colptr;
            strcpy(colname,fptr->Fptr->tableptr[(long)((long)&colptr[-1].twidth + 7)].ttype);
          }
          else {
            *stack0xffffffffffffffc0 = 0xdb;
            if (founde != 0xed) {
              snprintf((char *)&ii,0x51,"ffgcnn could not find column: %.45s",templt);
              ffpmsg((char *)&ii);
            }
          }
        }
        else if ((ivalue._4_4_ == 0) || (founde == 0xed)) {
          *stack0xffffffffffffffc0 = 0xed;
        }
      }
      else if (founde == 0xed) {
        *stack0xffffffffffffffc0 = 0xed;
      }
      fptr->Fptr->startcol = *colnum;
      return *stack0xffffffffffffffc0;
    }
    ffcmps(templt,local_c8->ttype,casesen,&unique,&local_b0);
    if (unique != 0) {
      if ((match != 0) && (local_b0 != 0)) {
        fptr->Fptr->startcol = *colnum;
        *stack0xffffffffffffffc0 = 0xed;
        return 0xed;
      }
      if (match == 0) {
        if (local_b0 == 0) {
          bVar2 = exact == 0;
          if (bVar2) {
            strcpy(colname,local_c8->ttype);
            *colnum = foundw + 1;
            fptr->Fptr->startcol = *colnum;
            exact = 1;
          }
          ivalue._4_4_ = (uint)bVar2;
        }
        else {
          strcpy(colname,local_c8->ttype);
          *colnum = foundw + 1;
          match = 1;
        }
      }
    }
    foundw = foundw + 1;
    local_c8 = local_c8 + 1;
  } while( true );
}

Assistant:

int ffgcnn( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  casesen,    /* I - case sensitive string comparison? 0=no  */
            char *templt,    /* I - input name of column (w/wildcards)      */
            char *colname,   /* O - full column name up to 68 + 1 chars long*/
            int  *colnum,    /* O - number of the named column; 1=first col */
            int  *status)    /* IO - error status                           */
/*
  Return the full column name and column number of the next column whose
  TTYPEn keyword value matches the input template string.
  The template may contain the * and ? wildcards.  Status = 237 is
  returned if the match is not unique.  If so, one may call this routine
  again with input status=237  to get the next match.  A status value of
  219 is returned when there are no more matching columns.
*/
{
    char errmsg[FLEN_ERRMSG];
    int tstatus, ii, founde, foundw, match, exact, unique;
    long ivalue;
    tcolumn *colptr;

    if (*status <= 0)
    {
        (fptr->Fptr)->startcol = 0;   /* start search with first column */
        tstatus = 0;
    }
    else if (*status == COL_NOT_UNIQUE) /* start search from previous spot */
    {
        tstatus = COL_NOT_UNIQUE;
        *status = 0;
    }
    else
        return(*status);  /* bad input status value */

    colname[0] = 0;    /* initialize null return */
    *colnum = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)   /* rescan header to get col struct */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += ((fptr->Fptr)->startcol);      /* offset to starting column */

    founde = FALSE;   /* initialize 'found exact match' flag */
    foundw = FALSE;   /* initialize 'found wildcard match' flag */
    unique = FALSE;

    for (ii = (fptr->Fptr)->startcol; ii < (fptr->Fptr)->tfield; ii++, colptr++)
    {
        ffcmps(templt, colptr->ttype, casesen, &match, &exact);
        if (match)
        {
            if (founde && exact)
            {
                /* warning: this is the second exact match we've found     */
                /*reset pointer to first match so next search starts there */
               (fptr->Fptr)->startcol = *colnum;
               return(*status = COL_NOT_UNIQUE);
            }
            else if (founde)   /* a wildcard match */
            {
                /* already found exact match so ignore this non-exact match */
            }
            else if (exact)
            {
                /* this is the first exact match we have found, so save it. */
                strcpy(colname, colptr->ttype);
                *colnum = ii + 1;
                founde = TRUE;
            }
            else if (foundw)
            {
                /* we have already found a wild card match, so not unique */
                /* continue searching for other matches                   */
                unique = FALSE;
            }
            else
            {
               /* this is the first wild card match we've found. save it */
               strcpy(colname, colptr->ttype);
               *colnum = ii + 1;
               (fptr->Fptr)->startcol = *colnum;
               foundw = TRUE;
               unique = TRUE;
            }
        }
    }

    /* OK, we've checked all the names now see if we got any matches */
    if (founde)
    {
        if (tstatus == COL_NOT_UNIQUE)  /* we did find 1 exact match but */
            *status = COL_NOT_UNIQUE;   /* there was a previous match too */
    }
    else if (foundw)
    {
        /* found one or more wildcard matches; report error if not unique */
       if (!unique || tstatus == COL_NOT_UNIQUE)
           *status = COL_NOT_UNIQUE;
    }
    else
    {
        /* didn't find a match; check if template is a positive integer */
        ffc2ii(templt, &ivalue, &tstatus);
        if (tstatus ==  0 && ivalue <= (fptr->Fptr)->tfield && ivalue > 0)
        {
            *colnum = ivalue;

            colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
            colptr += (ivalue - 1);    /* offset to correct column */
            strcpy(colname, colptr->ttype);
        }
        else
        {
            *status = COL_NOT_FOUND;
            if (tstatus != COL_NOT_UNIQUE)
            {
              snprintf(errmsg, FLEN_ERRMSG, "ffgcnn could not find column: %.45s", templt);
              ffpmsg(errmsg);
            }
        }
    }
    
    (fptr->Fptr)->startcol = *colnum;  /* save pointer for next time */
    return(*status);
}